

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O1

void __thiscall
QColorTransformPrivate::applyConvertIn<QCmyk32>
          (QColorTransformPrivate *this,QCmyk32 *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  QColorSpacePrivate *pQVar1;
  long lVar2;
  _Array_type *__vtable;
  long lVar3;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *pvVar4;
  long in_FS_OFFSET;
  anon_class_16_2_4b7f43a0 local_50;
  QColorVector *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = buffer;
  loadUnpremultipliedLUT(buffer,src,len);
  pQVar1 = (this->colorSpaceIn).d.ptr;
  lVar3 = (pQVar1->mAB).d.size;
  if (lVar3 != 0) {
    pvVar4 = (pQVar1->mAB).d.ptr;
    lVar3 = lVar3 * 0x1c8;
    do {
      lVar2 = (long)(char)*(__index_type *)
                           ((long)&(pvVar4->
                                   super__Variant_base<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   ).
                                   super__Move_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Copy_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Move_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Copy_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Variant_storage_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                           + 0x1c0);
      local_50.buffer = &local_40;
      local_50.len = len;
      if (lVar2 == -1) {
        abort();
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qcolortransform.cpp:1871:20)_&&,_const_std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_&>
        ::_S_vtable._M_arr[lVar2]._M_data)(&local_50,pvVar4);
      pvVar4 = pvVar4 + 1;
      lVar3 = lVar3 + -0x1c8;
    } while (lVar3 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}